

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

string * __thiscall
helics::CoreBroker::generateQueryAnswer_abi_cxx11_
          (string *__return_storage_ptr__,CoreBroker *this,string_view request,bool force_ordering)

{
  value_t vVar1;
  ushort index;
  json_value jVar2;
  pointer pBVar3;
  pointer pBVar4;
  pointer ptVar5;
  long lVar6;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  string_view request_00;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  bool bVar7;
  int iVar8;
  reference pvVar9;
  size_type sVar10;
  string *psVar11;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar12;
  const_iterator cVar13;
  ulong uVar14;
  _Head_base<0UL,_helics::fileops::JsonMapBuilder,_false> *p_Var15;
  char *key;
  data *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  GlobalFederateId *ele_3;
  object_t *poVar16;
  pointer pBVar17;
  GlobalFederateId *dep_1;
  BasicFedInfo *ele;
  pointer pBVar18;
  basic_string_view<char,_std::char_traits<char>_> bVar19;
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  initializer_list_t init_03;
  initializer_list_t init_04;
  initializer_list_t init_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_11;
  string_view fmt;
  string_view request_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_13;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_14;
  format_args args;
  json base;
  string_view request_local;
  json base_1;
  int local_26c;
  _Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> local_268;
  string interfaceQueryResult;
  data local_228;
  data local_218;
  data local_208;
  data local_1f8;
  data local_1e8;
  data local_1d8;
  data local_1c8;
  data local_1b8;
  data local_1a8;
  data local_198;
  anon_class_8_1_8991fb9c addHeader;
  string res;
  data local_160;
  data local_150;
  data local_140;
  data local_130;
  data local_120;
  data local_110;
  data local_100;
  data local_f0;
  data local_e0;
  data local_d0;
  data local_c0;
  data local_b0;
  data local_a0;
  data local_90;
  data local_80;
  data local_70;
  data local_60;
  data local_50;
  data local_40;
  
  request_local._M_str = request._M_str;
  request_local._M_len = request._M_len;
  this_00 = &base.m_data;
  addHeader.this = this;
  quickBrokerQueries_abi_cxx11_(&res,this,request);
  if (res._M_string_length != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res._M_dataplus._M_p == &res.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(res.field_2._M_allocated_capacity._1_7_,res.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = res.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = res._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(res.field_2._M_allocated_capacity._1_7_,res.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = res._M_string_length;
    res._M_string_length = 0;
    res.field_2._M_local_buf[0] = '\0';
    res._M_dataplus._M_p = (pointer)&res.field_2;
    goto LAB_002d411b;
  }
  __y._M_str = "counts";
  __y._M_len = 6;
  bVar7 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)request,__y);
  if (bVar7) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json(&base,(nullptr_t)0x0);
    generateQueryAnswer::anon_class_8_1_8991fb9c::operator()(&addHeader,&base);
    base_1.m_data._0_4_ =
         SUB84(((long)(this->mBrokers).dataStorage.
                      super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->mBrokers).dataStorage.
                     super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x58,0);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json<int,_int,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_40,(int *)&base_1);
    pvVar9 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&base,"brokers");
    vVar1 = (pvVar9->m_data).m_type;
    (pvVar9->m_data).m_type = local_40.m_type;
    jVar2 = (pvVar9->m_data).m_value;
    (pvVar9->m_data).m_value = local_40.m_value;
    local_40.m_type = vVar1;
    local_40.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_40);
    base_1.m_data._0_4_ =
         SUB84(((long)(this->mFederates).dataStorage.
                      super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->mFederates).dataStorage.
                     super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x38,0);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json<int,_int,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_50,(int *)&base_1);
    pvVar9 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&base,"federates");
    vVar1 = (pvVar9->m_data).m_type;
    (pvVar9->m_data).m_type = local_50.m_type;
    jVar2 = (pvVar9->m_data).m_value;
    (pvVar9->m_data).m_value = local_50.m_value;
    local_50.m_type = vVar1;
    local_50.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_50);
    base_1.m_data._0_4_ = getCountableFederates(this);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json<int,_int,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_60,(int *)&base_1);
    pvVar9 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&base,"countable_federates");
    vVar1 = (pvVar9->m_data).m_type;
    (pvVar9->m_data).m_type = local_60.m_type;
    jVar2 = (pvVar9->m_data).m_value;
    (pvVar9->m_data).m_value = local_60.m_value;
    local_60.m_type = vVar1;
    local_60.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_60);
    sVar10 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::size
                       (&(this->handles).handles);
    base_1.m_data._0_4_ = SUB84(sVar10,0);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json<int,_int,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_70,(int *)&base_1);
    pvVar9 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&base,"interfaces");
    vVar1 = (pvVar9->m_data).m_type;
    (pvVar9->m_data).m_type = local_70.m_type;
    jVar2 = (pvVar9->m_data).m_value;
    (pvVar9->m_data).m_value = local_70.m_value;
    local_70.m_type = vVar1;
    local_70.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_70);
    fileops::generateJsonString((string *)__return_storage_ptr__,&base,true);
    this_00 = &base.m_data;
  }
  else {
    bVar19._M_str = request_local._M_str;
    bVar19._M_len = request_local._M_len;
    __y_00._M_str = "summary";
    __y_00._M_len = 7;
    bVar7 = std::operator==(bVar19,__y_00);
    if (bVar7) {
      generateFederationSummary_abi_cxx11_(__return_storage_ptr__,this);
      goto LAB_002d411b;
    }
    __x._M_str = request_local._M_str;
    __x._M_len = request_local._M_len;
    __y_01._M_str = "config";
    __y_01._M_len = 6;
    bVar7 = std::operator==(__x,__y_01);
    if (bVar7) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json(&base_1,(nullptr_t)0x0);
      psVar11 = &(this->super_BrokerBase).identifier;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar11);
      pvVar9 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&base_1,"name");
      vVar1 = (pvVar9->m_data).m_type;
      (pvVar9->m_data).m_type = local_80.m_type;
      jVar2 = (pvVar9->m_data).m_value;
      (pvVar9->m_data).m_value = local_80.m_value;
      local_80.m_type = vVar1;
      local_80.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_80);
      if ((this->super_BrokerBase).uuid_like == true) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar11);
        pvVar9 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&base_1,"uuid");
        vVar1 = (pvVar9->m_data).m_type;
        (pvVar9->m_data).m_type = local_90.m_type;
        jVar2 = (pvVar9->m_data).m_value;
        (pvVar9->m_data).m_value = local_90.m_value;
        local_90.m_type = vVar1;
        local_90.m_value = jVar2;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_90);
      }
      if ((this->super_BrokerBase).field_0x294 == '\0') {
        base.m_data._0_4_ = (this->super_BrokerBase).higher_broker_id.gid;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json<int,_int,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_a0,(int *)&base);
        pvVar9 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&base_1,"parent");
        vVar1 = (pvVar9->m_data).m_type;
        (pvVar9->m_data).m_type = local_a0.m_type;
        jVar2 = (pvVar9->m_data).m_value;
        (pvVar9->m_data).m_value = local_a0.m_value;
        local_a0.m_type = vVar1;
        local_a0.m_value = jVar2;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_a0);
      }
      base.m_data._0_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<int,_int,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_b0,(int *)&base);
      pvVar9 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&base_1,"id");
      vVar1 = (pvVar9->m_data).m_type;
      (pvVar9->m_data).m_type = local_b0.m_type;
      jVar2 = (pvVar9->m_data).m_value;
      (pvVar9->m_data).m_value = local_b0.m_value;
      local_b0.m_type = vVar1;
      local_b0.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_b0);
      logLevelToString_abi_cxx11_(ERROR_LEVEL);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base);
      pvVar9 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&base_1,"log_level");
      vVar1 = (pvVar9->m_data).m_type;
      (pvVar9->m_data).m_type = local_c0.m_type;
      jVar2 = (pvVar9->m_data).m_value;
      (pvVar9->m_data).m_value = local_c0.m_value;
      local_c0.m_type = vVar1;
      local_c0.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_c0);
      std::__cxx11::string::~string((string *)&base);
      base.m_data._0_8_ =
           CONCAT71(base.m_data._1_7_,(this->super_BrokerBase).field_0x293) & 0xffffffffffffff01;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<bool,_bool,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_d0,(bool *)&base);
      pvVar9 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&base_1,"root");
      vVar1 = (pvVar9->m_data).m_type;
      (pvVar9->m_data).m_type = local_d0.m_type;
      jVar2 = (pvVar9->m_data).m_value;
      (pvVar9->m_data).m_value = local_d0.m_value;
      local_d0.m_type = vVar1;
      local_d0.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_d0);
      fileops::generateJsonString((string *)__return_storage_ptr__,&base_1,true);
      this_00 = &base_1.m_data;
    }
    else {
      __x_00._M_str = request_local._M_str;
      __x_00._M_len = request_local._M_len;
      __y_02._M_str = "monitor";
      __y_02._M_len = 7;
      bVar7 = std::operator==(__x_00,__y_02);
      if (bVar7) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&base_1,"\"",(allocator<char> *)&interfaceQueryResult);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &this->mTimeMonitorFederate);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base,
                       '\"');
        std::__cxx11::string::~string((string *)&base);
        psVar11 = (string *)&base_1;
LAB_002d43fe:
        std::__cxx11::string::~string((string *)psVar11);
        goto LAB_002d411b;
      }
      __x_01._M_str = request_local._M_str;
      __x_01._M_len = request_local._M_len;
      __y_03._M_str = "logs";
      __y_03._M_len = 4;
      bVar7 = std::operator==(__x_01,__y_03);
      if (!bVar7) {
        __x_02._M_str = request_local._M_str;
        __x_02._M_len = request_local._M_len;
        __y_04._M_str = "federates";
        __y_04._M_len = 9;
        bVar7 = std::operator==(__x_02,__y_04);
        if (bVar7) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"[",(allocator<char> *)&base);
          pBVar3 = (this->mFederates).dataStorage.
                   super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pBVar18 = (this->mFederates).dataStorage.
                         super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start; pBVar18 != pBVar3;
              pBVar18 = pBVar18 + 1) {
            std::__cxx11::string::string
                      ((string *)&base_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pBVar18)
            ;
            generateJsonQuotedString((string *)&base,(string *)&base_1);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base);
            std::__cxx11::string::~string((string *)&base);
            std::__cxx11::string::~string((string *)&base_1);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,',');
          }
          uVar14 = __return_storage_ptr__->_M_string_length;
          if (uVar14 < 2) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,']');
            goto LAB_002d411b;
          }
        }
        else {
          __x_03._M_str = request_local._M_str;
          __x_03._M_len = request_local._M_len;
          __y_05._M_str = "brokers";
          __y_05._M_len = 7;
          bVar7 = std::operator==(__x_03,__y_05);
          if (bVar7) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,"[",(allocator<char> *)&base);
            pBVar4 = (this->mBrokers).dataStorage.
                     super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pBVar17 = (this->mBrokers).dataStorage.
                           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start; pBVar17 != pBVar4;
                pBVar17 = pBVar17 + 1) {
              std::__cxx11::string::string
                        ((string *)&base_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pBVar17);
              generateJsonQuotedString((string *)&base,(string *)&base_1);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base);
              std::__cxx11::string::~string((string *)&base);
              std::__cxx11::string::~string((string *)&base_1);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __return_storage_ptr__,',');
            }
            uVar14 = __return_storage_ptr__->_M_string_length;
            if (uVar14 < 2) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __return_storage_ptr__,']');
              goto LAB_002d411b;
            }
          }
          else {
            __x_04._M_str = request_local._M_str;
            __x_04._M_len = request_local._M_len;
            __y_06._M_str = "subbrokers";
            __y_06._M_len = 10;
            bVar7 = std::operator==(__x_04,__y_06);
            if (bVar7) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,"[",(allocator<char> *)&base);
              pBVar4 = (this->mBrokers).dataStorage.
                       super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pBVar17 = (this->mBrokers).dataStorage.
                             super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start; pBVar17 != pBVar4;
                  pBVar17 = pBVar17 + 1) {
                if (pBVar17->_core == false) {
                  std::__cxx11::string::string
                            ((string *)&base_1,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pBVar17);
                  generateJsonQuotedString((string *)&base,(string *)&base_1);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base)
                  ;
                  std::__cxx11::string::~string((string *)&base);
                  std::__cxx11::string::~string((string *)&base_1);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __return_storage_ptr__,',');
                }
              }
              uVar14 = __return_storage_ptr__->_M_string_length;
              if (uVar14 < 2) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __return_storage_ptr__,']');
                goto LAB_002d411b;
              }
            }
            else {
              __x_05._M_str = request_local._M_str;
              __x_05._M_len = request_local._M_len;
              __y_07._M_str = "cores";
              __y_07._M_len = 5;
              bVar7 = std::operator==(__x_05,__y_07);
              if (!bVar7) {
                __x_06._M_str = request_local._M_str;
                __x_06._M_len = request_local._M_len;
                __y_08._M_str = "current_state";
                __y_08._M_len = 0xd;
                bVar7 = std::operator==(__x_06,__y_08);
                if (bVar7) {
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::basic_json(&base,(nullptr_t)0x0);
                  BrokerBase::addBaseInformation
                            (&this->super_BrokerBase,&base,
                             (bool)((this->super_BrokerBase).field_0x294 ^ 1));
                  psVar11 = brokerStateName_abi_cxx11_((this->super_BrokerBase).brokerState._M_i);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::
                  basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_e0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar11);
                  pvVar9 = nlohmann::json_abi_v3_11_3::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           ::operator[]<char_const>
                                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                       *)&base,"state");
                  vVar1 = (pvVar9->m_data).m_type;
                  (pvVar9->m_data).m_type = local_e0.m_type;
                  jVar2 = (pvVar9->m_data).m_value;
                  (pvVar9->m_data).m_value = local_e0.m_value;
                  local_e0.m_type = vVar1;
                  local_e0.m_value = jVar2;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::data::~data(&local_e0);
                  base_1.m_data.m_type =
                       (ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR) < 7;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::basic_json<bool,_bool,_0>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_f0,(bool *)&base_1);
                  pvVar9 = nlohmann::json_abi_v3_11_3::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           ::operator[]<char_const>
                                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                       *)&base,"status");
                  vVar1 = (pvVar9->m_data).m_type;
                  (pvVar9->m_data).m_type = local_f0.m_type;
                  jVar2 = (pvVar9->m_data).m_value;
                  (pvVar9->m_data).m_value = local_f0.m_value;
                  local_f0.m_type = vVar1;
                  local_f0.m_value = jVar2;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::data::~data(&local_f0);
                  init._M_len = 0;
                  init._M_array = (iterator)&local_100;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::array(init);
                  pvVar9 = nlohmann::json_abi_v3_11_3::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           ::operator[]<char_const>
                                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                       *)&base,"federates");
                  vVar1 = (pvVar9->m_data).m_type;
                  (pvVar9->m_data).m_type = local_100.m_type;
                  jVar2 = (pvVar9->m_data).m_value;
                  (pvVar9->m_data).m_value = local_100.m_value;
                  local_100.m_type = vVar1;
                  local_100.m_value = jVar2;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::data::~data(&local_100);
                  pBVar3 = (this->mFederates).dataStorage.
                           super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (pBVar18 = (this->mFederates).dataStorage.
                                 super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start; pBVar18 != pBVar3;
                      pBVar18 = pBVar18 + 1) {
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)&base_1.m_data,(nullptr_t)0x0);
                    init_00._M_len = 0;
                    init_00._M_array = (iterator)&local_1b8;
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::object(init_00);
                    pvVar9 = nlohmann::json_abi_v3_11_3::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             ::operator[]<char_const>
                                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                         *)&base_1.m_data,"attributes");
                    vVar1 = (pvVar9->m_data).m_type;
                    (pvVar9->m_data).m_type = local_1b8.m_type;
                    jVar2 = (pvVar9->m_data).m_value;
                    (pvVar9->m_data).m_value = local_1b8.m_value;
                    local_1b8.m_type = vVar1;
                    local_1b8.m_value = jVar2;
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::data::~data(&local_1b8);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::
                    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&local_1c8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pBVar18);
                    pbVar12 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)nlohmann::json_abi_v3_11_3::
                                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 ::operator[]<char_const>
                                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                             *)&base_1.m_data,"attributes");
                    pvVar9 = nlohmann::json_abi_v3_11_3::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             ::operator[]<char_const>(pbVar12,"name");
                    vVar1 = (pvVar9->m_data).m_type;
                    (pvVar9->m_data).m_type = local_1c8.m_type;
                    jVar2 = (pvVar9->m_data).m_value;
                    (pvVar9->m_data).m_value = local_1c8.m_value;
                    local_1c8.m_type = vVar1;
                    local_1c8.m_value = jVar2;
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::data::~data(&local_1c8);
                    psVar11 = stateString_abi_cxx11_(pBVar18->state);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::
                    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&local_1d8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar11);
                    pvVar9 = nlohmann::json_abi_v3_11_3::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             ::operator[]<char_const>
                                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                         *)&base_1.m_data,"state");
                    vVar1 = (pvVar9->m_data).m_type;
                    (pvVar9->m_data).m_type = local_1d8.m_type;
                    jVar2 = (pvVar9->m_data).m_value;
                    (pvVar9->m_data).m_value = local_1d8.m_value;
                    local_1d8.m_type = vVar1;
                    local_1d8.m_value = jVar2;
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::data::~data(&local_1d8);
                    interfaceQueryResult._M_dataplus._M_p._0_4_ = (pBVar18->global_id).gid;
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::basic_json<int,_int,_0>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&local_1e8,(int *)&interfaceQueryResult);
                    pbVar12 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)nlohmann::json_abi_v3_11_3::
                                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 ::operator[]<char_const>
                                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                             *)&base_1.m_data,"attributes");
                    pvVar9 = nlohmann::json_abi_v3_11_3::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             ::operator[]<char_const>(pbVar12,"id");
                    vVar1 = (pvVar9->m_data).m_type;
                    (pvVar9->m_data).m_type = local_1e8.m_type;
                    jVar2 = (pvVar9->m_data).m_value;
                    (pvVar9->m_data).m_value = local_1e8.m_value;
                    local_1e8.m_type = vVar1;
                    local_1e8.m_value = jVar2;
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::data::~data(&local_1e8);
                    interfaceQueryResult._M_dataplus._M_p._0_4_ = (pBVar18->parent).gid;
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::basic_json<int,_int,_0>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&local_198,(int *)&interfaceQueryResult);
                    pbVar12 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)nlohmann::json_abi_v3_11_3::
                                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 ::operator[]<char_const>
                                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                             *)&base_1.m_data,"attributes");
                    pvVar9 = nlohmann::json_abi_v3_11_3::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             ::operator[]<char_const>(pbVar12,"parent");
                    vVar1 = (pvVar9->m_data).m_type;
                    (pvVar9->m_data).m_type = local_198.m_type;
                    jVar2 = (pvVar9->m_data).m_value;
                    (pvVar9->m_data).m_value = local_198.m_value;
                    local_198.m_type = vVar1;
                    local_198.m_value = jVar2;
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::data::~data(&local_198);
                    pvVar9 = nlohmann::json_abi_v3_11_3::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             ::operator[]<char_const>
                                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                         *)&base,"federates");
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::push_back(pvVar9,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                        *)&base_1.m_data);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::data::~data(&base_1.m_data);
                  }
                  init_01._M_len = 0;
                  init_01._M_array = (iterator)&local_110;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::array(init_01);
                  pvVar9 = nlohmann::json_abi_v3_11_3::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           ::operator[]<char_const>
                                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                       *)&base,"cores");
                  vVar1 = (pvVar9->m_data).m_type;
                  (pvVar9->m_data).m_type = local_110.m_type;
                  jVar2 = (pvVar9->m_data).m_value;
                  (pvVar9->m_data).m_value = local_110.m_value;
                  local_110.m_type = vVar1;
                  local_110.m_value = jVar2;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::data::~data(&local_110);
                  init_02._M_len = 0;
                  init_02._M_array = (iterator)&local_120;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::array(init_02);
                  pvVar9 = nlohmann::json_abi_v3_11_3::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           ::operator[]<char_const>
                                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                       *)&base,"brokers");
                  vVar1 = (pvVar9->m_data).m_type;
                  (pvVar9->m_data).m_type = local_120.m_type;
                  jVar2 = (pvVar9->m_data).m_value;
                  (pvVar9->m_data).m_value = local_120.m_value;
                  local_120.m_type = vVar1;
                  local_120.m_value = jVar2;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::data::~data(&local_120);
                  pBVar4 = (this->mBrokers).dataStorage.
                           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (pBVar17 = (this->mBrokers).dataStorage.
                                 super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start; pBVar17 != pBVar4;
                      pBVar17 = pBVar17 + 1) {
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)&base_1.m_data,(nullptr_t)0x0);
                    psVar11 = stateString_abi_cxx11_(pBVar17->state);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::
                    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&local_1f8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar11);
                    pvVar9 = nlohmann::json_abi_v3_11_3::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             ::operator[]<char_const>
                                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                         *)&base_1.m_data,"state");
                    vVar1 = (pvVar9->m_data).m_type;
                    (pvVar9->m_data).m_type = local_1f8.m_type;
                    jVar2 = (pvVar9->m_data).m_value;
                    (pvVar9->m_data).m_value = local_1f8.m_value;
                    local_1f8.m_type = vVar1;
                    local_1f8.m_value = jVar2;
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::data::~data(&local_1f8);
                    init_03._M_len = 0;
                    init_03._M_array = (iterator)&local_208;
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::object(init_03);
                    pvVar9 = nlohmann::json_abi_v3_11_3::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             ::operator[]<char_const>
                                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                         *)&base_1.m_data,"attributes");
                    vVar1 = (pvVar9->m_data).m_type;
                    (pvVar9->m_data).m_type = local_208.m_type;
                    jVar2 = (pvVar9->m_data).m_value;
                    (pvVar9->m_data).m_value = local_208.m_value;
                    local_208.m_type = vVar1;
                    local_208.m_value = jVar2;
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::data::~data(&local_208);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::
                    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&local_218,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pBVar17);
                    pbVar12 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)nlohmann::json_abi_v3_11_3::
                                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 ::operator[]<char_const>
                                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                             *)&base_1.m_data,"attributes");
                    pvVar9 = nlohmann::json_abi_v3_11_3::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             ::operator[]<char_const>(pbVar12,"name");
                    vVar1 = (pvVar9->m_data).m_type;
                    (pvVar9->m_data).m_type = local_218.m_type;
                    jVar2 = (pvVar9->m_data).m_value;
                    (pvVar9->m_data).m_value = local_218.m_value;
                    local_218.m_type = vVar1;
                    local_218.m_value = jVar2;
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::data::~data(&local_218);
                    interfaceQueryResult._M_dataplus._M_p._0_4_ = (pBVar17->global_id).gid;
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::basic_json<int,_int,_0>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&local_228,(int *)&interfaceQueryResult);
                    pbVar12 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)nlohmann::json_abi_v3_11_3::
                                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 ::operator[]<char_const>
                                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                             *)&base_1.m_data,"attributes");
                    pvVar9 = nlohmann::json_abi_v3_11_3::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             ::operator[]<char_const>(pbVar12,"id");
                    vVar1 = (pvVar9->m_data).m_type;
                    (pvVar9->m_data).m_type = local_228.m_type;
                    jVar2 = (pvVar9->m_data).m_value;
                    (pvVar9->m_data).m_value = local_228.m_value;
                    local_228.m_type = vVar1;
                    local_228.m_value = jVar2;
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::data::~data(&local_228);
                    interfaceQueryResult._M_dataplus._M_p._0_4_ = (pBVar17->parent).gid;
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::basic_json<int,_int,_0>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&local_1a8,(int *)&interfaceQueryResult);
                    pbVar12 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)nlohmann::json_abi_v3_11_3::
                                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 ::operator[]<char_const>
                                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                             *)&base_1.m_data,"attributes");
                    pvVar9 = nlohmann::json_abi_v3_11_3::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             ::operator[]<char_const>(pbVar12,"parent");
                    vVar1 = (pvVar9->m_data).m_type;
                    (pvVar9->m_data).m_type = local_1a8.m_type;
                    jVar2 = (pvVar9->m_data).m_value;
                    (pvVar9->m_data).m_value = local_1a8.m_value;
                    local_1a8.m_type = vVar1;
                    local_1a8.m_value = jVar2;
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::data::~data(&local_1a8);
                    key = "brokers";
                    if (pBVar17->_core != false) {
                      key = "cores";
                    }
                    pvVar9 = nlohmann::json_abi_v3_11_3::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             ::operator[]<char_const>
                                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                         *)&base,key);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::push_back(pvVar9,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                        *)&base_1.m_data);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::data::~data(&base_1.m_data);
                  }
                  fileops::generateJsonString((string *)__return_storage_ptr__,&base,true);
                  this_00 = &base.m_data;
                  goto LAB_002d40f1;
                }
                __x_07._M_str = request_local._M_str;
                __x_07._M_len = request_local._M_len;
                __y_09._M_str = "current_time";
                __y_09._M_len = 0xc;
                bVar7 = std::operator==(__x_07,__y_09);
                if (bVar7) {
                  if ((this->super_BrokerBase).hasTimeDependency == false) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,"{}",(allocator<char> *)&base);
                  }
                  else {
                    (*((this->super_BrokerBase).timeCoord._M_t.
                       super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                       .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
                      _vptr_BaseTimeCoordinator[0xb])(__return_storage_ptr__);
                  }
                  goto LAB_002d411b;
                }
                __x_08._M_str = request_local._M_str;
                __x_08._M_len = request_local._M_len;
                __y_10._M_str = "time_monitor";
                __y_10._M_len = 0xc;
                bVar7 = std::operator==(__x_08,__y_10);
                if (bVar7) {
                  iVar8 = (this->mTimeMonitorFederateId).gid;
                  if ((iVar8 == -2010000000) || (iVar8 == -1700000000)) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,"{}",(allocator<char> *)&base);
                  }
                  else {
                    lVar6 = (this->mTimeMonitorCurrentTime).internalTimeCode;
                    base.m_data._0_8_ =
                         (double)(lVar6 % 1000000000) * 1e-09 + (double)(lVar6 / 1000000000);
                    fmt.size_ = 0xda;
                    fmt.data_ = (char *)0x1c;
                    args.field_1.args_ = in_R9.args_;
                    args.desc_ = (unsigned_long_long)&base;
                    ::fmt::v11::vformat_abi_cxx11_
                              ((string *)__return_storage_ptr__,
                               (v11 *)"{{\"time\":{}, \"federate\":{}}}",fmt,args);
                  }
                  goto LAB_002d411b;
                }
                __x_09._M_str = request_local._M_str;
                __x_09._M_len = request_local._M_len;
                __y_11._M_str = "global_status";
                __y_11._M_len = 0xd;
                bVar7 = std::operator==(__x_09,__y_11);
                if ((bVar7) &&
                   (6 < (ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR))) {
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::basic_json(&base,(nullptr_t)0x0);
                  BrokerBase::addBaseInformation
                            (&this->super_BrokerBase,&base,
                             (bool)((this->super_BrokerBase).field_0x294 ^ 1));
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::basic_json<const_char_(&)[13],_char[13],_0>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_130,(char (*) [13])0x396d59);
                  pvVar9 = nlohmann::json_abi_v3_11_3::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           ::operator[]<char_const>
                                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                       *)&base,"status");
                  vVar1 = (pvVar9->m_data).m_type;
                  (pvVar9->m_data).m_type = local_130.m_type;
                  jVar2 = (pvVar9->m_data).m_value;
                  (pvVar9->m_data).m_value = local_130.m_value;
                  local_130.m_type = vVar1;
                  local_130.m_value = jVar2;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::data::~data(&local_130);
                  base_1.m_data.m_type = ~null;
                  base_1.m_data._1_3_ = 0xffffff;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::basic_json<int,_int,_0>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_140,(int *)&base_1);
                  pvVar9 = nlohmann::json_abi_v3_11_3::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           ::operator[]<char_const>
                                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                       *)&base,"timestep");
                  vVar1 = (pvVar9->m_data).m_type;
                  (pvVar9->m_data).m_type = local_140.m_type;
                  jVar2 = (pvVar9->m_data).m_value;
                  (pvVar9->m_data).m_value = local_140.m_value;
                  local_140.m_type = vVar1;
                  local_140.m_value = jVar2;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::data::~data(&local_140);
                  fileops::generateJsonString((string *)__return_storage_ptr__,&base,true);
                  goto LAB_002d40f1;
                }
                iVar8 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  (&request_local,0,7,"rename:");
                if (iVar8 == 0) {
                  bVar19 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                     ((basic_string_view<char,_std::char_traits<char>_> *)
                                      &request_local,7,0xffffffffffffffff);
                  generateRename_abi_cxx11_(__return_storage_ptr__,this,(string_view)bVar19);
                  goto LAB_002d411b;
                }
                cVar13 = std::
                         _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                         ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                                 *)mapIndex,(key_type *)&request_local);
                if (cVar13._M_node != (_Base_ptr)(mapIndex + 8)) {
                  index = *(ushort *)&cVar13._M_node[1]._M_left;
                  ptVar5 = (this->mapBuilders).
                           super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if (((uint)index <
                       ((uint)(((long)(this->mapBuilders).
                                      super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar5) /
                              0x60) & 0xffff)) &&
                     (*(char *)((long)&cVar13._M_node[1]._M_left + 2) == '\0')) {
                    p_Var15 = &ptVar5[index].
                               super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                               .super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>;
                    bVar7 = fileops::JsonMapBuilder::isCompleted(&p_Var15->_M_head_impl);
                    if (bVar7) {
                      iVar8 = generateMapObjectCounter(this);
                      if (iVar8 == ptVar5[index].
                                   super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                   .super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>.
                                   _M_head_impl.counterCode) {
                        fileops::JsonMapBuilder::generate_abi_cxx11_
                                  ((string *)__return_storage_ptr__,&p_Var15->_M_head_impl);
                        goto LAB_002d411b;
                      }
                      fileops::JsonMapBuilder::reset(&p_Var15->_M_head_impl);
                    }
                    if ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)(p_Var15->_M_head_impl).jMap._M_t.
                           super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                           .
                           super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
                        != (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)0x0) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)__return_storage_ptr__,"#wait",(allocator<char> *)&base);
                      goto LAB_002d411b;
                    }
                  }
                  request_00._M_str = request_local._M_str;
                  request_00._M_len = request_local._M_len;
                  initializeMapBuilder
                            (this,request_00,index,
                             *(QueryReuse *)((long)&cVar13._M_node[1]._M_left + 2),force_ordering);
                  bVar7 = fileops::JsonMapBuilder::isCompleted
                                    (&(this->mapBuilders).
                                      super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[index].
                                      super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                      .super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>
                                      ._M_head_impl);
                  if (bVar7) {
                    if (*(char *)((long)&cVar13._M_node[1]._M_left + 2) == '\0') {
                      iVar8 = generateMapObjectCounter(this);
                      (this->mapBuilders).
                      super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[index].
                      super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                      .super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>._M_head_impl.
                      counterCode = iVar8;
                    }
                    p_Var15 = &(this->mapBuilders).
                               super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[index].
                               super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                               .super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>;
                    if (index == 9) {
                      generateGlobalStatus_abi_cxx11_
                                (__return_storage_ptr__,this,&p_Var15->_M_head_impl);
                    }
                    else {
                      fileops::JsonMapBuilder::generate_abi_cxx11_
                                ((string *)__return_storage_ptr__,&p_Var15->_M_head_impl);
                    }
                  }
                  else {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,"#wait",(allocator<char> *)&base);
                  }
                  goto LAB_002d411b;
                }
                base.m_data.m_value.object = (object_t *)0x0;
                base.m_data._0_8_ = addHeader.this;
                request_01._M_str = (char *)&this->handles;
                request_01._M_len = (size_t)request_local._M_str;
                generateInterfaceQueryResults
                          ((string *)&interfaceQueryResult,(helics *)request_local._M_len,request_01
                           ,(HandleManager *)0x8831d580,(GlobalFederateId)(BaseType)&base,
                           (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                            *)addHeader.this);
                std::_Function_base::~_Function_base((_Function_base *)&base);
                if (interfaceQueryResult._M_string_length == 0) {
                  __x_10._M_str = request_local._M_str;
                  __x_10._M_len = request_local._M_len;
                  __y_12._M_str = "dependson";
                  __y_12._M_len = 9;
                  bVar7 = std::operator==(__x_10,__y_12);
                  if (bVar7) {
                    BaseTimeCoordinator::getDependencies
                              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                *)&local_268,
                               (this->super_BrokerBase).timeCoord._M_t.
                               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>.
                               _M_head_impl);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,"[",(allocator<char> *)&base);
                    for (; local_268._M_impl.super__Vector_impl_data._M_start !=
                           local_268._M_impl.super__Vector_impl_data._M_finish;
                        local_268._M_impl.super__Vector_impl_data._M_start =
                             (pointer)&(((object_t *)
                                        local_268._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                       _M_impl.field_0x4) {
                      std::__cxx11::to_string
                                ((string *)&base_1,
                                 *(int *)&(((object_t *)
                                           local_268._M_impl.super__Vector_impl_data._M_start)->_M_t
                                          )._M_impl);
                      generateJsonQuotedString((string *)&base,(string *)&base_1);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__return_storage_ptr__,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&base);
                      std::__cxx11::string::~string((string *)&base);
                      std::__cxx11::string::~string((string *)&base_1);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__return_storage_ptr__,',');
                    }
                    uVar14 = __return_storage_ptr__->_M_string_length;
                    if (uVar14 < 2) {
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__return_storage_ptr__,']');
                    }
                    else {
LAB_002d546f:
                      (__return_storage_ptr__->_M_dataplus)._M_p[uVar14 - 1] = ']';
                    }
                  }
                  else {
                    __x_11._M_str = request_local._M_str;
                    __x_11._M_len = request_local._M_len;
                    __y_13._M_str = "dependents";
                    __y_13._M_len = 10;
                    bVar7 = std::operator==(__x_11,__y_13);
                    if (!bVar7) {
                      __x_12._M_str = request_local._M_str;
                      __x_12._M_len = request_local._M_len;
                      __y_14._M_str = "dependencies";
                      __y_14._M_len = 0xc;
                      bVar7 = std::operator==(__x_12,__y_14);
                      if (bVar7) {
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::basic_json(&base_1,(nullptr_t)0x0);
                        BrokerBase::addBaseInformation
                                  (&this->super_BrokerBase,&base_1,
                                   (bool)((this->super_BrokerBase).field_0x294 ^ 1));
                        init_04._M_len = 0;
                        init_04._M_array = (iterator)&local_150;
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::array(init_04);
                        pvVar9 = nlohmann::json_abi_v3_11_3::
                                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 ::operator[]<char_const>
                                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                             *)&base_1,"dependents");
                        vVar1 = (pvVar9->m_data).m_type;
                        (pvVar9->m_data).m_type = local_150.m_type;
                        jVar2 = (pvVar9->m_data).m_value;
                        (pvVar9->m_data).m_value = local_150.m_value;
                        local_150.m_type = vVar1;
                        local_150.m_value = jVar2;
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::data::~data(&local_150);
                        BaseTimeCoordinator::getDependents
                                  ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                    *)&base,(this->super_BrokerBase).timeCoord._M_t.
                                            super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                                            .
                                            super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>
                                            ._M_head_impl);
                        jVar2 = base.m_data.m_value;
                        for (poVar16 = (object_t *)base.m_data._0_8_; poVar16 != jVar2.object;
                            poVar16 = (object_t *)&(poVar16->_M_t)._M_impl.field_0x4) {
                          pvVar9 = nlohmann::json_abi_v3_11_3::
                                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   ::operator[]<char_const>
                                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                               *)&base_1,"dependents");
                          local_26c = *(int *)&(poVar16->_M_t)._M_impl;
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::basic_json<int,_int,_0>
                                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)&local_268,&local_26c);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::push_back(pvVar9,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                              *)&local_268);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::data::~data((data *)&local_268);
                        }
                        std::
                        _Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                        ::~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                         *)&base);
                        init_05._M_len = 0;
                        init_05._M_array = (iterator)&local_160;
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::array(init_05);
                        pvVar9 = nlohmann::json_abi_v3_11_3::
                                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 ::operator[]<char_const>
                                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                             *)&base_1,"dependencies");
                        vVar1 = (pvVar9->m_data).m_type;
                        (pvVar9->m_data).m_type = local_160.m_type;
                        jVar2 = (pvVar9->m_data).m_value;
                        (pvVar9->m_data).m_value = local_160.m_value;
                        local_160.m_type = vVar1;
                        local_160.m_value = jVar2;
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::data::~data(&local_160);
                        BaseTimeCoordinator::getDependencies
                                  ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                    *)&base,(this->super_BrokerBase).timeCoord._M_t.
                                            super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                                            .
                                            super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>
                                            ._M_head_impl);
                        jVar2 = base.m_data.m_value;
                        for (poVar16 = (object_t *)base.m_data._0_8_; poVar16 != jVar2.object;
                            poVar16 = (object_t *)&(poVar16->_M_t)._M_impl.field_0x4) {
                          pvVar9 = nlohmann::json_abi_v3_11_3::
                                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   ::operator[]<char_const>
                                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                               *)&base_1,"dependencies");
                          local_26c = *(int *)&(poVar16->_M_t)._M_impl;
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::basic_json<int,_int,_0>
                                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)&local_268,&local_26c);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::push_back(pvVar9,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                              *)&local_268);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::data::~data((data *)&local_268);
                        }
                        std::
                        _Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                        ::~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                         *)&base);
                        fileops::generateJsonString((string *)__return_storage_ptr__,&base_1,true);
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::data::~data(&base_1.m_data);
                      }
                      else {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&base,"unrecognized broker query",
                                   (allocator<char> *)&base_1);
                        generateJsonErrorResponse
                                  ((string *)__return_storage_ptr__,BAD_REQUEST,(string *)&base);
                        std::__cxx11::string::~string((string *)&base);
                      }
                      goto LAB_002d55a1;
                    }
                    BaseTimeCoordinator::getDependents
                              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                *)&local_268,
                               (this->super_BrokerBase).timeCoord._M_t.
                               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>.
                               _M_head_impl);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,"[",(allocator<char> *)&base);
                    for (; local_268._M_impl.super__Vector_impl_data._M_start !=
                           local_268._M_impl.super__Vector_impl_data._M_finish;
                        local_268._M_impl.super__Vector_impl_data._M_start =
                             (pointer)&(((object_t *)
                                        local_268._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                       _M_impl.field_0x4) {
                      std::__cxx11::to_string
                                ((string *)&base_1,
                                 *(int *)&(((object_t *)
                                           local_268._M_impl.super__Vector_impl_data._M_start)->_M_t
                                          )._M_impl);
                      generateJsonQuotedString((string *)&base,(string *)&base_1);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__return_storage_ptr__,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&base);
                      std::__cxx11::string::~string((string *)&base);
                      std::__cxx11::string::~string((string *)&base_1);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__return_storage_ptr__,',');
                    }
                    uVar14 = __return_storage_ptr__->_M_string_length;
                    if (1 < uVar14) goto LAB_002d546f;
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__return_storage_ptr__,']');
                  }
                  std::
                  _Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                  ::~_Vector_base(&local_268);
                }
                else {
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)interfaceQueryResult._M_dataplus._M_p == &interfaceQueryResult.field_2) {
                    (__return_storage_ptr__->field_2)._M_allocated_capacity =
                         CONCAT71(interfaceQueryResult.field_2._M_allocated_capacity._1_7_,
                                  interfaceQueryResult.field_2._M_local_buf[0]);
                    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                         interfaceQueryResult.field_2._8_8_;
                  }
                  else {
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         interfaceQueryResult._M_dataplus._M_p;
                    (__return_storage_ptr__->field_2)._M_allocated_capacity =
                         CONCAT71(interfaceQueryResult.field_2._M_allocated_capacity._1_7_,
                                  interfaceQueryResult.field_2._M_local_buf[0]);
                  }
                  __return_storage_ptr__->_M_string_length = interfaceQueryResult._M_string_length;
                  interfaceQueryResult._M_string_length = 0;
                  interfaceQueryResult.field_2._M_local_buf[0] = '\0';
                  interfaceQueryResult._M_dataplus._M_p = (pointer)&interfaceQueryResult.field_2;
                }
LAB_002d55a1:
                psVar11 = &interfaceQueryResult;
                goto LAB_002d43fe;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,"[",(allocator<char> *)&base);
              pBVar4 = (this->mBrokers).dataStorage.
                       super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pBVar17 = (this->mBrokers).dataStorage.
                             super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start; pBVar17 != pBVar4;
                  pBVar17 = pBVar17 + 1) {
                if (pBVar17->_core == true) {
                  std::__cxx11::string::string
                            ((string *)&base_1,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pBVar17);
                  generateJsonQuotedString((string *)&base,(string *)&base_1);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base)
                  ;
                  std::__cxx11::string::~string((string *)&base);
                  std::__cxx11::string::~string((string *)&base_1);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __return_storage_ptr__,',');
                }
              }
              uVar14 = __return_storage_ptr__->_M_string_length;
              if (uVar14 < 2) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __return_storage_ptr__,']');
                goto LAB_002d411b;
              }
            }
          }
        }
        (__return_storage_ptr__->_M_dataplus)._M_p[uVar14 - 1] = ']';
        goto LAB_002d411b;
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json(&base,(nullptr_t)0x0);
      BrokerBase::addBaseInformation
                (&this->super_BrokerBase,&base,(bool)((this->super_BrokerBase).field_0x294 ^ 1));
      bufferToJson(&((this->super_BrokerBase).mLogManager.
                     super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    mLogBuffer,&base);
      fileops::generateJsonString((string *)__return_storage_ptr__,&base,true);
      this_00 = &base.m_data;
    }
  }
LAB_002d40f1:
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(this_00);
LAB_002d411b:
  std::__cxx11::string::~string((string *)&res);
  return __return_storage_ptr__;
}

Assistant:

std::string CoreBroker::generateQueryAnswer(std::string_view request, bool force_ordering)
{
    auto addHeader = [this](nlohmann::json& base) { addBaseInformation(base, !isRootc); };

    auto res = quickBrokerQueries(request);
    if (!res.empty()) {
        return res;
    }
    if (request == "counts") {
        nlohmann::json base;
        addHeader(base);
        base["brokers"] = static_cast<int>(mBrokers.size());
        base["federates"] = static_cast<int>(mFederates.size());
        base["countable_federates"] = getCountableFederates();
        base["interfaces"] = static_cast<int>(handles.size());
        return fileops::generateJsonString(base);
    }
    if (request == "summary") {
        return generateFederationSummary();
    }
    if (request == "config") {
        nlohmann::json base;
        base["name"] = getIdentifier();
        if (uuid_like) {
            base["uuid"] = getIdentifier();
        }
        if (!isRootc) {
            base["parent"] = higher_broker_id.baseValue();
        }
        base["id"] = global_broker_id_local.baseValue();
        base["log_level"] = logLevelToString(static_cast<LogLevels>(maxLogLevel.load()));
        base["root"] = isRoot();
        return fileops::generateJsonString(base);
    }
    if (request == "monitor") {
        return std::string{"\""} + mTimeMonitorFederate + '"';
    }
    if (request == "logs") {
        nlohmann::json base;
        addBaseInformation(base, !isRootc);
        bufferToJson(mLogManager->getLogBuffer(), base);
        return fileops::generateJsonString(base);
    }
    if (request == "federates") {
        return generateStringVector(mFederates, [](auto& fed) { return fed.name; });
    }
    if (request == "brokers") {
        return generateStringVector(mBrokers, [](auto& brk) { return brk.name; });
    }
    if (request == "subbrokers") {
        return generateStringVector_if(
            mBrokers, [](auto& brk) { return brk.name; }, [](auto& brk) { return !brk._core; });
    }
    if (request == "cores") {
        return generateStringVector_if(
            mBrokers, [](auto& brk) { return brk.name; }, [](auto& brk) { return brk._core; });
    }
    if (request == "current_state") {
        nlohmann::json base;
        addBaseInformation(base, !isRootc);
        base["state"] = brokerStateName(getBrokerState());
        base["status"] = isConnected();
        base["federates"] = nlohmann::json::array();
        for (const auto& fed : mFederates) {
            nlohmann::json fedstate;
            fedstate["attributes"] = nlohmann::json::object();
            fedstate["attributes"]["name"] = fed.name;
            fedstate["state"] = stateString(fed.state);
            fedstate["attributes"]["id"] = fed.global_id.baseValue();
            fedstate["attributes"]["parent"] = fed.parent.baseValue();
            base["federates"].push_back(std::move(fedstate));
        }
        base["cores"] = nlohmann::json::array();
        base["brokers"] = nlohmann::json::array();
        for (const auto& brk : mBrokers) {
            nlohmann::json brkstate;
            brkstate["state"] = stateString(brk.state);
            brkstate["attributes"] = nlohmann::json::object();
            brkstate["attributes"]["name"] = brk.name;
            brkstate["attributes"]["id"] = brk.global_id.baseValue();
            brkstate["attributes"]["parent"] = brk.parent.baseValue();
            if (brk._core) {
                base["cores"].push_back(std::move(brkstate));
            } else {
                base["brokers"].push_back(std::move(brkstate));
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "current_time") {
        if (!hasTimeDependency) {
            return "{}";
        }
        return timeCoord->printTimeStatus();
    }
    if (request == "time_monitor") {
        if (mTimeMonitorFederateId.isValid()) {
            return fmt::format(R"raw({{"time":{}, "federate":{}}})raw",
                               static_cast<double>(mTimeMonitorCurrentTime),
                               mTimeMonitorFederate);
        }
        return "{}";
    }
    if (request == "global_status") {
        if (!isConnected()) {
            nlohmann::json json;
            addBaseInformation(json, !isRootc);
            json["status"] = "disconnected";
            json["timestep"] = -1;
            return fileops::generateJsonString(json);
        }
    }
    if (request.compare(0, 7, "rename:") == 0) {
        return generateRename(request.substr(7));
    }
    auto mapping = mapIndex.find(request);
    if (mapping != mapIndex.end()) {
        auto index = mapping->second.first;
        if (isValidIndex(index, mapBuilders) && mapping->second.second == QueryReuse::ENABLED) {
            auto& builder = std::get<0>(mapBuilders[index]);
            if (builder.isCompleted()) {
                auto center = generateMapObjectCounter();
                if (center == builder.getCounterCode()) {
                    return builder.generate();
                }
                builder.reset();
            }
            if (builder.isActive()) {
                return "#wait";
            }
        }

        initializeMapBuilder(request, index, mapping->second.second, force_ordering);
        if (std::get<0>(mapBuilders[index]).isCompleted()) {
            if (mapping->second.second == QueryReuse::ENABLED) {
                auto center = generateMapObjectCounter();
                std::get<0>(mapBuilders[index]).setCounterCode(center);
            }
            if (index == GLOBAL_STATUS) {
                return generateGlobalStatus(std::get<0>(mapBuilders[index]));
            }
            return std::get<0>(mapBuilders[index]).generate();
        }
        return "#wait";
    }
    auto interfaceQueryResult =
        generateInterfaceQueryResults(request, handles, GlobalFederateId{}, addHeader);
    if (!interfaceQueryResult.empty()) {
        return interfaceQueryResult;
    }
    if (request == "dependson") {
        return generateStringVector(timeCoord->getDependencies(), [](const auto& dep) {
            return std::to_string(dep.baseValue());
        });
    }
    if (request == "dependents") {
        return generateStringVector(timeCoord->getDependents(), [](const auto& dep) {
            return std::to_string(dep.baseValue());
        });
    }
    if (request == "dependencies") {
        nlohmann::json base;
        addBaseInformation(base, !isRootc);
        base["dependents"] = nlohmann::json::array();
        for (const auto& dep : timeCoord->getDependents()) {
            base["dependents"].push_back(dep.baseValue());
        }
        base["dependencies"] = nlohmann::json::array();
        for (const auto& dep : timeCoord->getDependencies()) {
            base["dependencies"].push_back(dep.baseValue());
        }
        return fileops::generateJsonString(base);
    }
    return generateJsonErrorResponse(JsonErrorCodes::BAD_REQUEST, "unrecognized broker query");
}